

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainEth1394.cpp
# Opt level: O3

bool CheckEthernetV3(AmpIO *Board,uint chan)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  ostream *poVar4;
  ostream *poVar5;
  char *pcVar6;
  char *pcVar7;
  uint16_t phyid2;
  uint16_t phyreg21;
  uint16_t phyreg17;
  uint16_t phyid1;
  uint16_t phyCR;
  uint16_t local_3a;
  ushort local_38;
  ushort local_36;
  uint16_t local_34;
  uint16_t local_32;
  
  bVar3 = CheckRTL8211F_RegIO(Board,chan,1);
  if (bVar3) {
    local_34 = 0;
    local_3a = 0;
    bVar3 = FpgaIO::ReadRTL8211F_Register(&Board->super_FpgaIO,chan,1,2,&local_34);
    if (!bVar3) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Failed to read PHY",0x12);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," PHYID1",7);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
    }
    bVar3 = FpgaIO::ReadRTL8211F_Register(&Board->super_FpgaIO,chan,1,3,&local_3a);
    if (!bVar3) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Failed to read PHY",0x12);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," PHYID2",7);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"PHY",3);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
         *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 8;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," PHYID1: ",9);
    lVar1 = *(long *)poVar5;
    *(undefined8 *)(poVar5 + *(long *)(lVar1 + -0x18) + 0x10) = 4;
    lVar1 = *(long *)(lVar1 + -0x18);
    poVar4 = poVar5 + lVar1;
    if (poVar5[lVar1 + 0xe1] == (ostream)0x0) {
      std::ios::widen((char)poVar4);
      poVar4[0xe1] = (ostream)0x1;
    }
    poVar4[0xe0] = (ostream)0x30;
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," (should be 001c),",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," PHYID2: ",9);
    lVar1 = *(long *)poVar5;
    *(undefined8 *)(poVar5 + *(long *)(lVar1 + -0x18) + 0x10) = 4;
    lVar1 = *(long *)(lVar1 + -0x18);
    poVar4 = poVar5 + lVar1;
    if (poVar5[lVar1 + 0xe1] == (ostream)0x0) {
      std::ios::widen((char)poVar4);
      poVar4[0xe1] = (ostream)0x1;
    }
    poVar4[0xe0] = (ostream)0x30;
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," (should be c916)",0x11);
    lVar1 = *(long *)poVar4;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xffffffb5 | 2;
    std::ios::widen((char)*(undefined8 *)(lVar1 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    bVar3 = FpgaIO::WriteRTL8211F_Register(&Board->super_FpgaIO,chan,1,0x1f,0xd08);
    if (!bVar3) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Failed to set PHY",0x11);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," PAGSR to 0xd08",0xf);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
    }
    bVar3 = FpgaIO::ReadRTL8211F_Register(&Board->super_FpgaIO,chan,1,0x11,&local_36);
    if (!bVar3) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Failed to read PHY",0x12);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," Page 0xd08, Reg 17",0x13);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"PHY",3);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," Page 0xd08, Register 17: ",0x1a);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    lVar1 = *(long *)poVar4;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xffffffb5 | 2;
    std::ios::widen((char)*(undefined8 *)(lVar1 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Tx Delay: ",10);
    bVar3 = (local_36 >> 8 & 1) != 0;
    pcVar7 = "ON";
    pcVar6 = "ON";
    if (!bVar3) {
      pcVar6 = "OFF";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,pcVar6,3 - (ulong)bVar3);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
    std::ostream::put(-0x20);
    std::ostream::flush();
    bVar3 = FpgaIO::ReadRTL8211F_Register(&Board->super_FpgaIO,chan,1,0x15,&local_38);
    if (!bVar3) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Failed to read PHY",0x12);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," Page 0xd08, Reg 21",0x13);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"PHY",3);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," Page 0xd08, Register 21: ",0x1a);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    lVar1 = *(long *)poVar4;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xffffffb5 | 2;
    std::ios::widen((char)*(undefined8 *)(lVar1 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Rx Delay: ",10);
    bVar3 = (local_38 & 8) == 0;
    if (bVar3) {
      pcVar7 = "OFF";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,pcVar7,(ulong)bVar3 | 2);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
    std::ostream::put(-0x20);
    std::ostream::flush();
    bVar3 = FpgaIO::WriteRTL8211F_Register(&Board->super_FpgaIO,chan,1,0x1f,0xa42);
    if (!bVar3) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Failed to write PHY",0x13);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," PAGSR",6);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
    }
    bVar3 = FpgaIO::ReadRTL8211F_Register(&Board->super_FpgaIO,chan,8,0x10,&local_32);
    if (bVar3) {
      *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"GMII PHY Reg 16: ",0x11);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      lVar1 = *(long *)poVar4;
      *(uint *)(poVar4 + *(long *)(lVar1 + -0x18) + 0x18) =
           *(uint *)(poVar4 + *(long *)(lVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Failed to read GMII PHY",0x17);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," Reg 16",7);
      lVar1 = *(long *)poVar4;
    }
    std::ios::widen((char)*(undefined8 *)(lVar1 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    bVar3 = local_3a == 0xc916 && local_34 == 0x1c;
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool CheckEthernetV3(AmpIO &Board, unsigned int chan)
{
    unsigned int phyAddr = FpgaIO::PHY_RTL8211F;

    // Check Register I/O
    if (!CheckRTL8211F_RegIO(Board, chan, phyAddr))
        return false;

    // Check PHYID1 and PHYID2 (assumes we are on correct page)
    uint16_t phyid1 = 0, phyid2 = 0;
    if (!Board.ReadRTL8211F_Register(chan, phyAddr, FpgaIO::RTL8211F_PHYID1, phyid1))
        std::cout << "Failed to read PHY" << chan << " PHYID1" << std::endl;
    if (!Board.ReadRTL8211F_Register(chan, phyAddr, FpgaIO::RTL8211F_PHYID2, phyid2))
        std::cout << "Failed to read PHY" << chan << " PHYID2" << std::endl;
    std::cout << "PHY" << chan << std::hex
              << " PHYID1: " << std::setw(4) << std::setfill('0') << phyid1 << " (should be 001c),"
              << " PHYID2: " << std::setw(4) << std::setfill('0') << phyid2 << " (should be c916)"
              << std::dec << std::endl;

    // Now, check undocumented registers 0x11 (17) and 0x15 (21) on page 0xd08
    //   Register 17, Bit 8 (0x0100) indicates state of TX_DELAY
    //   Register 21, Bit 3 (0x0008) indicates state of RX_DELAY
    if (!Board.WriteRTL8211F_Register(chan, phyAddr, FpgaIO::RTL8211F_PAGSR, 0xd08))
        std::cout << "Failed to set PHY" << chan << " PAGSR to 0xd08" << std::endl;
    uint16_t phyreg17, phyreg21;
    if (!Board.ReadRTL8211F_Register(chan, phyAddr, 17, phyreg17))
        std::cout << "Failed to read PHY" << chan << " Page 0xd08, Reg 17" << std::endl;
    std::cout << "PHY" << chan << std::hex << " Page 0xd08, Register 17: " << phyreg17 << std::dec << std::endl;
    std::cout << "Tx Delay: " << ((phyreg17 & 0x0100) ? "ON" : "OFF") << std::endl;
    if (!Board.ReadRTL8211F_Register(chan, phyAddr, 21, phyreg21))
        std::cout << "Failed to read PHY" << chan << " Page 0xd08, Reg 21" << std::endl;
    std::cout << "PHY" << chan << std::hex << " Page 0xd08, Register 21: " << phyreg21 << std::dec << std::endl;
    std::cout << "Rx Delay: " << ((phyreg21 & 0x0008) ? "ON" : "OFF") << std::endl;

    // Restore default page
    if (!Board.WriteRTL8211F_Register(chan, phyAddr, FpgaIO::RTL8211F_PAGSR, FpgaIO::RTL8211F_PAGE_DEFAULT))
        std::cout << "Failed to write PHY" << chan << " PAGSR" << std::endl;

    // Check GMII to RGMII core PHY register
    // Based on the VHDL source code for this core, PHY Specific Control Register 1 should be at address 16
    uint16_t phyCR;
    if (!Board.ReadRTL8211F_Register(chan, FpgaIO::PHY_GMII_CORE, 16, phyCR)) {
        std::cout << "Failed to read GMII PHY" << chan << " Reg 16" << std::endl;
    }
    else {
        std::cout << std::hex << "GMII PHY Reg 16: " << phyCR << std::dec << std::endl;
    }

    return (phyid1 == 0x001c) && (phyid2 == 0xc916);
}